

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.cc
# Opt level: O2

int test_mp_read_typed(void)

{
  byte bVar1;
  char cVar2;
  mp_type mVar3;
  double dVar4;
  undefined4 uVar5;
  int iVar6;
  uint uVar7;
  int extraout_EAX;
  int64_t iVar8;
  uint64_t uVar9;
  bool is_ok;
  bool is_ok_00;
  bool is_ok_01;
  bool is_ok_02;
  bool is_ok_03;
  bool is_ok_04;
  bool is_ok_05;
  bool is_ok_06;
  bool is_ok_07;
  bool is_ok_08;
  bool is_ok_09;
  bool is_ok_10;
  bool is_ok_11;
  bool is_ok_12;
  bool is_ok_13;
  bool is_ok_14;
  bool is_ok_15;
  bool is_ok_16;
  bool is_ok_17;
  bool is_ok_18;
  bool is_ok_19;
  bool is_ok_20;
  bool is_ok_21;
  bool is_ok_22;
  bool is_ok_23;
  bool is_ok_24;
  bool is_ok_25;
  bool is_ok_26;
  bool is_ok_27;
  bool is_ok_28;
  bool is_ok_29;
  bool is_ok_30;
  bool is_ok_31;
  bool is_ok_32;
  bool is_ok_33;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  char *pcVar10;
  undefined8 extraout_RDX_05;
  undefined8 extraout_RDX_06;
  uint32_t size;
  char *pcVar11;
  undefined1 uVar12;
  _func_int_char_ptr_ptr_int_ptr *read_f;
  _func_int_char_ptr_ptr_long_ptr *read_f_00;
  char **data;
  undefined8 uVar13;
  long lVar14;
  char (*pacVar15) [16];
  ulong uVar16;
  char *pcVar17;
  ulong uVar18;
  float fVar19;
  float num1;
  undefined4 extraout_XMM0_Da;
  float num1_00;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  char *pcStack_2a8;
  char *pcStack_2a0;
  char *pcStack_298;
  char (*pacStack_290) [16];
  char *pcStack_288;
  char *pcStack_280;
  ulong uStack_278;
  char *pcStack_270;
  char *local_268;
  char *mp_num_pos1;
  uint8_t local_251;
  char *mp_num_pos2;
  ulong local_248;
  mp_type local_23c;
  char mp_nums [16] [16];
  char str [256];
  undefined1 local_38 [8];
  
  pcStack_270 = (char *)0x12136b;
  _plan(0x2cc,true);
  pcStack_270 = (char *)0x12137a;
  _space((FILE *)_stdout);
  pcStack_270 = (char *)0x12138f;
  printf("# *** %s ***\n","test_mp_read_typed");
  pcStack_270 = (char *)0x121399;
  test_read_num<signed_char,int,int(*)(char_const**,signed_char*)>
            (0xc,(_func_int_char_ptr_ptr_char_ptr *)0x1,is_ok);
  pcStack_270 = (char *)0x1213a3;
  test_read_num<signed_char,int,int(*)(char_const**,signed_char*)>
            (0x7f,(_func_int_char_ptr_ptr_char_ptr *)0x1,is_ok_00);
  pcStack_270 = (char *)0x1213af;
  test_read_num<signed_char,int,int(*)(char_const**,signed_char*)>
            (0x80,(_func_int_char_ptr_ptr_char_ptr *)0x0,is_ok_01);
  pcStack_270 = (char *)0x1213b9;
  test_read_num<signed_char,int,int(*)(char_const**,signed_char*)>
            (-0xc,(_func_int_char_ptr_ptr_char_ptr *)0x1,is_ok_02);
  pcStack_270 = (char *)0x1213c3;
  test_read_num<signed_char,int,int(*)(char_const**,signed_char*)>
            (-0x80,(_func_int_char_ptr_ptr_char_ptr *)0x1,is_ok_03);
  pcStack_270 = (char *)0x1213cf;
  test_read_num<signed_char,int,int(*)(char_const**,signed_char*)>
            (-0x81,(_func_int_char_ptr_ptr_char_ptr *)0x0,is_ok_04);
  builtin_strncpy(str,"typed read of ",0xf);
  pcStack_270 = (char *)0x12141c;
  iVar6 = snprintf(str + 0xe,0xf2,"%f",0x40000000);
  pcVar10 = str + (long)iVar6 + 0xe;
  pcStack_270 = (char *)0x121440;
  iVar6 = snprintf(pcVar10,(size_t)(local_38 + -(long)pcVar10)," into ");
  pcStack_270 = (char *)0x12145d;
  snprintf(pcVar10 + iVar6,(size_t)(local_38 + -(long)(pcVar10 + iVar6)),"int%zu_t",8);
  pcStack_270 = (char *)0x121465;
  _space((FILE *)_stdout);
  pcStack_270 = (char *)0x12147a;
  fwrite("# ",2,1,_stdout);
  pcStack_270 = (char *)0x12148a;
  fputs(str,_stdout);
  pcStack_270 = (char *)0x121495;
  fputc(10,_stdout);
  mp_nums[0][0] = -0x36;
  mp_nums[0][1] = -0x47;
  mp_nums[0][2] = -99;
  mp_nums[0][3] = 'I';
  mp_nums[0][4] = 'R';
  mp_nums[1][0] = -0x35;
  mp_nums[1][1] = -0x41;
  mp_nums[1][2] = '3';
  mp_nums[1][3] = -0x57;
  mp_nums[1][4] = '*';
  mp_nums[1][5] = '@';
  mp_nums[1][6] = '\0';
  mp_nums[1][7] = '\0';
  mp_nums[1][8] = '\0';
  for (lVar14 = 0; uVar5 = str._12_4_, lVar14 != 0x20; lVar14 = lVar14 + 0x10) {
    pcVar10 = mp_nums[0] + lVar14;
    bVar1 = *pcVar10;
    mVar3 = mp_type_hint[bVar1];
    mp_num_pos1 = pcVar10;
    if (mVar3 == MP_UINT) {
      pcStack_270 = (char *)0x121536;
      uVar9 = mp_decode_uint(&mp_num_pos1);
      if (uVar9 != 0) goto LAB_0012240b;
    }
    else if (mVar3 == MP_FLOAT) {
      pcStack_270 = (char *)0x12151d;
      fVar19 = mp_decode_float(&mp_num_pos1);
      if ((fVar19 != -0.0003) || (NAN(fVar19))) goto LAB_00122bd1;
    }
    else if (mVar3 == MP_INT) {
      pcStack_270 = (char *)0x12150e;
      iVar8 = mp_decode_int(&mp_num_pos1);
      if (iVar8 != 0) goto LAB_00122c1d;
    }
    else {
      pcStack_270 = (char *)0x121545;
      dVar4 = mp_decode_double(&mp_num_pos1);
      if ((dVar4 != -0.0003000000142492354) || (NAN(dVar4))) goto LAB_0012300a;
    }
    local_248 = local_248 & 0xffffffffffffff00;
    pcStack_270 = (char *)0x121576;
    mp_num_pos2 = pcVar10;
    iVar6 = mp_read_int8(&mp_num_pos2,(int8_t *)&local_248);
    pcStack_270 = (char *)0x12159f;
    _ok((uint)(iVar6 == -1),"rc == -1",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x737,"check failure for code 0x%02X",(ulong)(uint)(int)(char)bVar1);
    pcStack_270 = (char *)0x1215bf;
    _ok((uint)(pcVar10 == mp_num_pos2),"mp_num_pos2 == mp_nums[i]",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x738,"check position");
  }
  builtin_strncpy(str,"typed read of ",0xf);
  str[0xf] = SUB41(uVar5,3);
  pcStack_270 = (char *)0x121607;
  iVar6 = snprintf(str + 0xe,0xf2,"%lf",0xcccccccd);
  pcVar10 = str + (long)iVar6 + 0xe;
  pcStack_270 = (char *)0x121633;
  iVar6 = snprintf(pcVar10,(size_t)(local_38 + -(long)pcVar10)," into ");
  pcStack_270 = (char *)0x121650;
  snprintf(pcVar10 + iVar6,(size_t)(local_38 + -(long)(pcVar10 + iVar6)),"int%zu_t",8);
  pcStack_270 = (char *)0x12165f;
  _space((FILE *)_stdout);
  pcStack_270 = (char *)0x121678;
  fwrite("# ",2,1,_stdout);
  pcStack_270 = (char *)0x121688;
  fputs(str,_stdout);
  pcStack_270 = (char *)0x121693;
  fputc(10,_stdout);
  mp_nums[0][0] = -0x35;
  mp_nums[0][1] = '@';
  mp_nums[0][2] = '^';
  mp_nums[0][3] = -0x24;
  mp_nums[0][4] = -0x34;
  mp_nums[0][5] = -0x34;
  mp_nums[0][6] = -0x34;
  mp_nums[0][7] = -0x34;
  mp_nums[0][8] = -0x33;
  pcStack_270 = (char *)0x121710;
  mp_num_pos1 = mp_nums[0];
  dVar4 = mp_decode_double(&mp_num_pos1);
  if ((dVar4 != 123.45) || (NAN(dVar4))) {
LAB_0012300a:
    pcVar10 = "mp_decode_double(&mp_num_pos1) == (double)num1";
    uVar13 = 0x730;
    goto LAB_0012307a;
  }
  local_23c = MP_DOUBLE;
  local_248 = local_248 & 0xffffffffffffff00;
  pcStack_270 = (char *)0x121740;
  mp_num_pos2 = mp_nums[0];
  iVar6 = mp_read_int8(&mp_num_pos2,(int8_t *)&local_248);
  pcStack_270 = (char *)0x121771;
  _ok((uint)(iVar6 == -1),"rc == -1",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x737,
      "check failure for code 0x%02X",0xffffffffffffffcb);
  pcStack_270 = (char *)0x121797;
  _ok((uint)((char (*) [16])mp_num_pos2 == mp_nums),"mp_num_pos2 == mp_nums[i]",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x738,
      "check position");
  builtin_strncpy(str + 0x10,"f reading ",0xb);
  builtin_strncpy(str,"ensure failure o",0x10);
  pcStack_270 = (char *)0x1217cb;
  snprintf(str + 0x1a,0xe6,"int%zu_t",8);
  pcStack_270 = (char *)0x1217da;
  _space((FILE *)_stdout);
  pcStack_270 = (char *)0x1217f2;
  fwrite("# ",2,1,_stdout);
  pcStack_270 = (char *)0x121802;
  fputs(str,_stdout);
  pcStack_270 = (char *)0x12180d;
  fputc(10,_stdout);
  mp_nums[0][0] = -0x6f;
  mp_nums[1][0] = -0x7f;
  pcStack_270 = (char *)0x12182b;
  mp_encode_str0(mp_nums[2],"abc");
  mp_nums[3][0] = -0x3d;
  local_251 = '\0';
  mp_nums[4][1] = '\x03';
  mp_nums[4][1] = '\x03';
  mp_nums[4][0] = -0x39;
  mp_nums[4][2] = '\x01';
  mp_nums[4][5] = 'c';
  mp_nums[4][3] = 'a';
  mp_nums[4][4] = 'b';
  mp_nums[5][0] = -0x3c;
  mp_nums[5][1] = '\x03';
  mp_nums[5][2] = 'a';
  mp_nums[5][3] = 'b';
  mp_nums[5][4] = 'c';
  mp_nums[6][0] = -0x40;
  uVar13 = extraout_RDX;
  for (lVar14 = 0; lVar14 != 0x70; lVar14 = lVar14 + 0x10) {
    pcVar10 = mp_nums[0] + lVar14;
    cVar2 = *pcVar10;
    pcStack_270 = (char *)0x1218c0;
    mp_num_pos1 = pcVar10;
    iVar6 = mp_read_int8(&mp_num_pos1,(int8_t *)&mp_num_pos2);
    pcStack_270 = (char *)0x1218e9;
    _ok((uint)(iVar6 == -1),"rc == -1",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x76d,"check fail for code 0x%02X",(ulong)(uint)(int)cVar2);
    pcStack_270 = (char *)0x12190c;
    _ok((uint)(pcVar10 == mp_num_pos1),"pos == bad_types[i]",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x76e,"check position for code 0x%02X",(ulong)(uint)(int)cVar2);
    uVar13 = extraout_RDX_00;
  }
  pcStack_270 = (char *)0x12191f;
  test_read_num<short,int,int(*)(char_const**,short*)>
            (0x7b,(_func_int_char_ptr_ptr_short_ptr *)0x1,SUB81(uVar13,0));
  pcStack_270 = (char *)0x12192b;
  test_read_num<short,int,int(*)(char_const**,short*)>
            (0x7fff,(_func_int_char_ptr_ptr_short_ptr *)0x1,is_ok_05);
  pcStack_270 = (char *)0x121937;
  test_read_num<short,int,int(*)(char_const**,short*)>
            (0x8000,(_func_int_char_ptr_ptr_short_ptr *)0x0,is_ok_06);
  pcStack_270 = (char *)0x121941;
  test_read_num<short,int,int(*)(char_const**,short*)>
            (-0x7b,(_func_int_char_ptr_ptr_short_ptr *)0x1,is_ok_07);
  pcStack_270 = (char *)0x12194d;
  test_read_num<short,int,int(*)(char_const**,short*)>
            (-0x8000,(_func_int_char_ptr_ptr_short_ptr *)0x1,is_ok_08);
  pcStack_270 = (char *)0x121959;
  test_read_num<short,int,int(*)(char_const**,short*)>
            (-0x8001,(_func_int_char_ptr_ptr_short_ptr *)0x0,is_ok_09);
  uVar5 = str._12_4_;
  builtin_strncpy(str,"typed read of ",0xf);
  str[0xf] = SUB41(uVar5,3);
  pcStack_270 = (char *)0x121998;
  iVar6 = snprintf(str + 0xe,0xf2,"%f",0xe0000000);
  pcVar10 = str + (long)iVar6 + 0xe;
  pcStack_270 = (char *)0x1219c4;
  iVar6 = snprintf(pcVar10,(size_t)(local_38 + -(long)pcVar10)," into ");
  pcStack_270 = (char *)0x1219e1;
  snprintf(pcVar10 + iVar6,(size_t)(local_38 + -(long)(pcVar10 + iVar6)),"int%zu_t",0x10);
  pcStack_270 = (char *)0x1219f0;
  _space((FILE *)_stdout);
  pcStack_270 = (char *)0x121a05;
  fwrite("# ",2,1,_stdout);
  pcStack_270 = (char *)0x121a15;
  fputs(str,_stdout);
  pcStack_270 = (char *)0x121a20;
  fputc(10,_stdout);
  uVar13 = mp_nums[0]._1_8_;
  builtin_strncpy(mp_nums[0],"ʻ\x03\x12o",5);
  mp_nums[0]._5_4_ = SUB84(uVar13,4);
  mp_nums[1][0] = -0x35;
  mp_nums[1][1] = -0x41;
  mp_nums[1][2] = '`';
  mp_nums[1][3] = 'b';
  mp_nums[1][4] = 'M';
  mp_nums[1][5] = -0x20;
  mp_nums[1][6] = '\0';
  mp_nums[1][7] = '\0';
  mp_nums[1][8] = '\0';
  for (lVar14 = 0; uVar5 = str._12_4_, lVar14 != 0x20; lVar14 = lVar14 + 0x10) {
    pcVar10 = mp_nums[0] + lVar14;
    bVar1 = *pcVar10;
    mVar3 = mp_type_hint[bVar1];
    mp_num_pos1 = pcVar10;
    if (mVar3 == MP_UINT) {
      pcStack_270 = (char *)0x121ac1;
      uVar9 = mp_decode_uint(&mp_num_pos1);
      if (uVar9 != 0) goto LAB_0012240b;
    }
    else if (mVar3 == MP_FLOAT) {
      pcStack_270 = (char *)0x121aa8;
      fVar19 = mp_decode_float(&mp_num_pos1);
      if ((fVar19 != -0.002) || (NAN(fVar19))) goto LAB_00122bd1;
    }
    else if (mVar3 == MP_INT) {
      pcStack_270 = (char *)0x121a99;
      iVar8 = mp_decode_int(&mp_num_pos1);
      if (iVar8 != 0) goto LAB_00122c1d;
    }
    else {
      pcStack_270 = (char *)0x121ad0;
      dVar4 = mp_decode_double(&mp_num_pos1);
      if ((dVar4 != -0.0020000000949949026) || (NAN(dVar4))) goto LAB_0012300a;
    }
    local_248 = local_248 & 0xffffffffffff0000;
    pcStack_270 = (char *)0x121b02;
    mp_num_pos2 = pcVar10;
    iVar6 = mp_read_int16(&mp_num_pos2,(int16_t *)&local_248);
    pcStack_270 = (char *)0x121b2b;
    _ok((uint)(iVar6 == -1),"rc == -1",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x737,"check failure for code 0x%02X",(ulong)(uint)(int)(char)bVar1);
    pcStack_270 = (char *)0x121b4b;
    _ok((uint)(pcVar10 == mp_num_pos2),"mp_num_pos2 == mp_nums[i]",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x738,"check position");
  }
  builtin_strncpy(str,"typed read of ",0xf);
  str[0xf] = SUB41(uVar5,3);
  pcStack_270 = (char *)0x121b93;
  iVar6 = snprintf(str + 0xe,0xf2,"%lf",0xd70a3d71);
  pcVar10 = str + (long)iVar6 + 0xe;
  pcStack_270 = (char *)0x121bbf;
  iVar6 = snprintf(pcVar10,(size_t)(local_38 + -(long)pcVar10)," into ");
  pcStack_270 = (char *)0x121bdc;
  snprintf(pcVar10 + iVar6,(size_t)(local_38 + -(long)(pcVar10 + iVar6)),"int%zu_t",0x10);
  pcStack_270 = (char *)0x121beb;
  _space((FILE *)_stdout);
  pcStack_270 = (char *)0x121c04;
  fwrite("# ",2,1,_stdout);
  pcStack_270 = (char *)0x121c14;
  fputs(str,_stdout);
  pcStack_270 = (char *)0x121c1f;
  fputc(10,_stdout);
  mp_nums[0][0] = -0x35;
  mp_nums[0][1] = '@';
  mp_nums[0][2] = '(';
  mp_nums[0][3] = -0x50;
  mp_nums[0][4] = -0x5d;
  mp_nums[0][5] = -0x29;
  mp_nums[0][6] = '\n';
  mp_nums[0][7] = '=';
  mp_nums[0][8] = 'q';
  mp_num_pos1 = mp_nums[0];
  if (local_23c == MP_UINT) {
    pcStack_270 = (char *)0x121c83;
    uVar9 = mp_decode_uint(&mp_num_pos1);
    if (uVar9 == 0xc) goto LAB_00121ca7;
LAB_0012240b:
    pcVar10 = "mp_decode_uint(&mp_num_pos1) == (uint64_t)num1";
    uVar13 = 0x72a;
    goto LAB_0012307a;
  }
  if (local_23c == MP_FLOAT) {
    pcStack_270 = (char *)0x121c6a;
    fVar19 = mp_decode_float(&mp_num_pos1);
    if ((fVar19 == 12.345) && (!NAN(fVar19))) goto LAB_00121ca7;
LAB_00122bd1:
    pcVar10 = "mp_decode_float(&mp_num_pos1) == (float)num1";
    uVar13 = 0x72d;
  }
  else {
    if (local_23c == MP_INT) {
      pcStack_270 = (char *)0x121c5a;
      iVar8 = mp_decode_int(&mp_num_pos1);
      if (iVar8 == 0xc) goto LAB_00121ca7;
    }
    else {
      pcStack_270 = (char *)0x121c93;
      dVar4 = mp_decode_double(&mp_num_pos1);
      if ((dVar4 != 12.345) || (NAN(dVar4))) goto LAB_0012300a;
LAB_00121ca7:
      local_248 = local_248 & 0xffffffffffff0000;
      pcStack_270 = (char *)0x121cc0;
      mp_num_pos2 = mp_nums[0];
      iVar6 = mp_read_int16(&mp_num_pos2,(int16_t *)&local_248);
      pcStack_270 = (char *)0x121cf1;
      _ok((uint)(iVar6 == -1),"rc == -1",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x737,"check failure for code 0x%02X",0xffffffffffffffcb);
      pcStack_270 = (char *)0x121d17;
      _ok((uint)((char (*) [16])mp_num_pos2 == mp_nums),"mp_num_pos2 == mp_nums[i]",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x738,"check position");
      builtin_strncpy(str + 0x10,"f reading ",0xb);
      builtin_strncpy(str,"ensure failure o",0x10);
      pcStack_270 = (char *)0x121d4d;
      snprintf(str + 0x1a,0xe6,"int%zu_t",0x10);
      pcStack_270 = (char *)0x121d5c;
      _space((FILE *)_stdout);
      pcStack_270 = (char *)0x121d74;
      fwrite("# ",2,1,_stdout);
      pcStack_270 = (char *)0x121d84;
      fputs(str,_stdout);
      pcStack_270 = (char *)0x121d8f;
      fputc(10,_stdout);
      mp_nums[0][0] = -0x6f;
      mp_nums[1][0] = -0x7f;
      pcVar10 = "abc";
      pcStack_270 = (char *)0x121dad;
      mp_encode_str0(mp_nums[2],"abc");
      mp_nums[3][0] = -0x3d;
      lVar14 = 1;
      mp_nums[4][0] = local_251;
      if (local_251 == '\0') {
        mp_nums[4][1] = '\x03';
        mp_nums[4][0] = 199;
        lVar14 = 2;
      }
      mp_nums[4][lVar14] = '\x01';
      mp_nums[4][lVar14 + 3] = 'c';
      (mp_nums[4] + lVar14 + 1)[0] = 'a';
      (mp_nums[4] + lVar14 + 1)[1] = 'b';
      mp_nums[5][0] = -0x3c;
      mp_nums[5][1] = '\x03';
      mp_nums[5][2] = 'a';
      mp_nums[5][3] = 'b';
      mp_nums[5][4] = 'c';
      mp_nums[6][0] = -0x40;
      uVar13 = extraout_RDX_01;
      for (lVar14 = 0; lVar14 != 0x70; lVar14 = lVar14 + 0x10) {
        pcVar17 = mp_nums[0] + lVar14;
        cVar2 = *pcVar17;
        pcStack_270 = (char *)0x121e3d;
        mp_num_pos1 = pcVar17;
        iVar6 = mp_read_int16(&mp_num_pos1,(int16_t *)&mp_num_pos2);
        pcStack_270 = (char *)0x121e66;
        _ok((uint)(iVar6 == -1),"rc == -1",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
            0x76d,"check fail for code 0x%02X",(ulong)(uint)(int)cVar2);
        pcVar10 = "pos == bad_types[i]";
        pcStack_270 = (char *)0x121e89;
        _ok((uint)(pcVar17 == mp_num_pos1),"pos == bad_types[i]",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
            0x76e,"check position for code 0x%02X",(ulong)(uint)(int)cVar2);
        uVar13 = extraout_RDX_02;
      }
      pcStack_270 = (char *)0x121ea1;
      test_read_num<int,int,int(*)(char_const**,int*)>
                (0x7b,(_func_int_char_ptr_ptr_int_ptr *)pcVar10,SUB81(uVar13,0));
      pcStack_270 = (char *)0x121eab;
      test_read_num<int,int,int(*)(char_const**,int*)>
                (0x3039,(_func_int_char_ptr_ptr_int_ptr *)pcVar10,is_ok_10);
      pcStack_270 = (char *)0x121eb5;
      test_read_num<int,int,int(*)(char_const**,int*)>
                (0x7fffffff,(_func_int_char_ptr_ptr_int_ptr *)pcVar10,is_ok_11);
      read_f = (_func_int_char_ptr_ptr_int_ptr *)0x0;
      pcStack_270 = (char *)0x121ec4;
      test_read_num<int,long,int(*)(char_const**,int*)>
                (0x80000000,(_func_int_char_ptr_ptr_int_ptr *)0x0,is_ok_12);
      pcStack_270 = (char *)0x121ecc;
      test_read_num<int,int,int(*)(char_const**,int*)>(-0x7b,read_f,is_ok_13);
      pcStack_270 = (char *)0x121ed6;
      test_read_num<int,int,int(*)(char_const**,int*)>(-0x3039,read_f,is_ok_14);
      pcStack_270 = (char *)0x121ee5;
      test_read_num<int,long,int(*)(char_const**,int*)>
                (-0x80000000,(_func_int_char_ptr_ptr_int_ptr *)0x1,is_ok_15);
      uVar5 = str._12_4_;
      builtin_strncpy(str,"typed read of ",0xf);
      str[0xf] = SUB41(uVar5,3);
      pcStack_270 = (char *)0x121f1f;
      iVar6 = snprintf(str + 0xe,0xf2,"%lld",0xffffffff7fffffff);
      pcVar10 = str + (long)iVar6 + 0xe;
      pcStack_270 = (char *)0x121f4b;
      iVar6 = snprintf(pcVar10,(size_t)(local_38 + -(long)pcVar10)," into ");
      pcStack_270 = (char *)0x121f68;
      snprintf(pcVar10 + iVar6,(size_t)(local_38 + -(long)(pcVar10 + iVar6)),"int%zu_t",0x20);
      pcStack_270 = (char *)0x121f77;
      _space((FILE *)_stdout);
      pcStack_270 = (char *)0x121f8c;
      fwrite("# ",2,1,_stdout);
      pcStack_270 = (char *)0x121f9c;
      fputs(str,_stdout);
      pcStack_270 = (char *)0x121fa7;
      fputc(10,_stdout);
      pcStack_270 = (char *)0x121fb4;
      uVar7 = test_encode_int_all_sizes(mp_nums,-0x80000001);
      uVar18 = (ulong)uVar7;
      if ((int)uVar7 < 1) {
        uVar18 = 0;
      }
      for (lVar14 = 0; uVar5 = str._12_4_, uVar18 * 0x10 != lVar14; lVar14 = lVar14 + 0x10) {
        pcVar10 = mp_nums[0] + lVar14;
        bVar1 = *pcVar10;
        mVar3 = mp_type_hint[bVar1];
        mp_num_pos1 = pcVar10;
        if (mVar3 == MP_UINT) {
          pcStack_270 = (char *)0x122042;
          uVar9 = mp_decode_uint(&mp_num_pos1);
          if (uVar9 != 0xffffffff7fffffff) goto LAB_0012240b;
        }
        else if (mVar3 == MP_FLOAT) {
          pcStack_270 = (char *)0x122029;
          fVar19 = mp_decode_float(&mp_num_pos1);
          if ((fVar19 != -2.1474836e+09) || (NAN(fVar19))) goto LAB_00122bd1;
        }
        else if (mVar3 == MP_INT) {
          pcStack_270 = (char *)0x122010;
          iVar8 = mp_decode_int(&mp_num_pos1);
          if (iVar8 != -0x80000001) goto LAB_00122c1d;
        }
        else {
          pcStack_270 = (char *)0x12205b;
          dVar4 = mp_decode_double(&mp_num_pos1);
          if ((dVar4 != -2147483649.0) || (NAN(dVar4))) goto LAB_0012300a;
        }
        local_248 = local_248 & 0xffffffff00000000;
        pcStack_270 = (char *)0x12208c;
        mp_num_pos2 = pcVar10;
        iVar6 = mp_read_int32(&mp_num_pos2,(int32_t *)&local_248);
        pcStack_270 = (char *)0x1220b5;
        _ok((uint)(iVar6 == -1),"rc == -1",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
            0x737,"check failure for code 0x%02X",(ulong)(uint)(int)(char)bVar1);
        pcStack_270 = (char *)0x1220d9;
        _ok((uint)(pcVar10 == mp_num_pos2),"mp_num_pos2 == mp_nums[i]",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
            0x738,"check position");
      }
      builtin_strncpy(str,"typed read of ",0xf);
      str[0xf] = SUB41(uVar5,3);
      pcStack_270 = (char *)0x122121;
      iVar6 = snprintf(str + 0xe,0xf2,"%f",0);
      pcVar10 = str + (long)iVar6 + 0xe;
      pcStack_270 = (char *)0x12214d;
      iVar6 = snprintf(pcVar10,(size_t)(local_38 + -(long)pcVar10)," into ");
      pcStack_270 = (char *)0x12216a;
      snprintf(pcVar10 + iVar6,(size_t)(local_38 + -(long)(pcVar10 + iVar6)),"int%zu_t",0x20);
      pcStack_270 = (char *)0x122179;
      _space((FILE *)_stdout);
      pcStack_270 = (char *)0x12218e;
      fwrite("# ",2,1,_stdout);
      pcStack_270 = (char *)0x12219e;
      fputs(str,_stdout);
      pcStack_270 = (char *)0x1221a9;
      fputc(10,_stdout);
      mp_nums[0][0] = -0x36;
      mp_nums[0][1] = -0x3e;
      mp_nums[0][2] = -0x38;
      mp_nums[0][3] = '\0';
      mp_nums[0][4] = '\0';
      mp_nums[1][0] = -0x35;
      mp_nums[1][1] = -0x40;
      mp_nums[1][2] = 'Y';
      mp_nums[1][3] = '\0';
      mp_nums[1][4] = '\0';
      mp_nums[1][5] = '\0';
      mp_nums[1][6] = '\0';
      mp_nums[1][7] = '\0';
      mp_nums[1][8] = '\0';
      pcVar10 = "mp_num_pos2 == mp_nums[i]";
      pcVar17 = "check position";
      for (pacVar15 = (char (*) [16])0x0; uVar5 = str._12_4_, pacVar15 != (char (*) [16])0x20;
          pacVar15 = pacVar15 + 1) {
        pcVar11 = *pacVar15 + (long)mp_nums[0];
        bVar1 = *pcVar11;
        uVar18 = (ulong)bVar1;
        mVar3 = mp_type_hint[uVar18];
        mp_num_pos1 = pcVar11;
        if (mVar3 == MP_INT) {
          pcStack_270 = (char *)0x122235;
          iVar8 = mp_decode_int(&mp_num_pos1);
          if (iVar8 != -100) goto LAB_00122c1d;
        }
        else if (mVar3 == MP_FLOAT) {
          pcStack_270 = (char *)0x122217;
          fVar19 = mp_decode_float(&mp_num_pos1);
          if ((fVar19 != -100.0) || (NAN(fVar19))) goto LAB_00122bd1;
        }
        else {
          if (mVar3 == MP_UINT) goto LAB_00123089;
          pcStack_270 = (char *)0x122253;
          dVar4 = mp_decode_double(&mp_num_pos1);
          if ((dVar4 != -100.0) || (NAN(dVar4))) goto LAB_0012300a;
        }
        local_248 = local_248 & 0xffffffff00000000;
        pcStack_270 = (char *)0x122284;
        mp_num_pos2 = pcVar11;
        iVar6 = mp_read_int32(&mp_num_pos2,(int32_t *)&local_248);
        pcStack_270 = (char *)0x1222ad;
        _ok((uint)(iVar6 == -1),"rc == -1",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
            0x737,"check failure for code 0x%02X",(ulong)(uint)(int)(char)bVar1);
        pcStack_270 = (char *)0x1222cd;
        _ok((uint)(pcVar11 == mp_num_pos2),"mp_num_pos2 == mp_nums[i]",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
            0x738,"check position");
      }
      builtin_strncpy(str,"typed read of ",0xf);
      str[0xf] = SUB41(uVar5,3);
      pcStack_270 = (char *)0x122315;
      iVar6 = snprintf(str + 0xe,0xf2,"%lf",0x126e978d);
      pcVar10 = str + (long)iVar6 + 0xe;
      pcStack_270 = (char *)0x122341;
      iVar6 = snprintf(pcVar10,(size_t)(local_38 + -(long)pcVar10)," into ");
      pcStack_270 = (char *)0x12235e;
      snprintf(pcVar10 + iVar6,(size_t)(local_38 + -(long)(pcVar10 + iVar6)),"int%zu_t",0x20);
      pcStack_270 = (char *)0x12236d;
      _space((FILE *)_stdout);
      pcStack_270 = (char *)0x122386;
      fwrite("# ",2,1,_stdout);
      pcStack_270 = (char *)0x122396;
      fputs(str,_stdout);
      pcStack_270 = (char *)0x1223a1;
      fputc(10,_stdout);
      mp_nums[0][0] = -0x35;
      mp_nums[0][1] = '?';
      mp_nums[0][2] = -0xd;
      mp_nums[0][3] = -0x40;
      mp_nums[0][4] = -0x7d;
      mp_nums[0][5] = '\x12';
      mp_nums[0][6] = 'n';
      mp_nums[0][7] = -0x69;
      mp_nums[0][8] = -0x73;
      mp_num_pos1 = mp_nums[0];
      if (local_23c == MP_UINT) {
        pcStack_270 = (char *)0x122405;
        uVar9 = mp_decode_uint(&mp_num_pos1);
        if (uVar9 != 1) goto LAB_0012240b;
      }
      else if (local_23c == MP_FLOAT) {
        pcStack_270 = (char *)0x1223ec;
        fVar19 = mp_decode_float(&mp_num_pos1);
        if ((fVar19 != 1.2345) || (NAN(fVar19))) goto LAB_00122bd1;
      }
      else if (local_23c == MP_INT) {
        pcStack_270 = (char *)0x1223dc;
        iVar8 = mp_decode_int(&mp_num_pos1);
        if (iVar8 != 1) goto LAB_00122c1d;
      }
      else {
        pcStack_270 = (char *)0x12244c;
        dVar4 = mp_decode_double(&mp_num_pos1);
        if ((dVar4 != 1.2345) || (NAN(dVar4))) goto LAB_0012300a;
      }
      local_248 = local_248 & 0xffffffff00000000;
      pcStack_270 = (char *)0x122478;
      mp_num_pos2 = mp_nums[0];
      iVar6 = mp_read_int32(&mp_num_pos2,(int32_t *)&local_248);
      pcStack_270 = (char *)0x1224a9;
      _ok((uint)(iVar6 == -1),"rc == -1",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x737,"check failure for code 0x%02X",0xffffffffffffffcb);
      pcStack_270 = (char *)0x1224cf;
      _ok((uint)((char (*) [16])mp_num_pos2 == mp_nums),"mp_num_pos2 == mp_nums[i]",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x738,"check position");
      builtin_strncpy(str + 0x10,"f reading ",0xb);
      builtin_strncpy(str,"ensure failure o",0x10);
      pcStack_270 = (char *)0x122505;
      snprintf(str + 0x1a,0xe6,"int%zu_t",0x20);
      pcStack_270 = (char *)0x122514;
      _space((FILE *)_stdout);
      pcStack_270 = (char *)0x12252c;
      fwrite("# ",2,1,_stdout);
      pcStack_270 = (char *)0x12253c;
      fputs(str,_stdout);
      pcStack_270 = (char *)0x122547;
      fputc(10,_stdout);
      mp_nums[0][0] = -0x6f;
      mp_nums[1][0] = -0x7f;
      pcVar10 = "abc";
      pcStack_270 = (char *)0x122565;
      mp_encode_str0(mp_nums[2],"abc");
      mp_nums[3][0] = -0x3d;
      lVar14 = 1;
      mp_nums[4][0] = local_251;
      if (local_251 == '\0') {
        mp_nums[4][1] = '\x03';
        mp_nums[4][0] = 199;
        lVar14 = 2;
      }
      mp_nums[4][lVar14] = '\x01';
      mp_nums[4][lVar14 + 3] = 'c';
      (mp_nums[4] + lVar14 + 1)[0] = 'a';
      (mp_nums[4] + lVar14 + 1)[1] = 'b';
      mp_nums[5][0] = -0x3c;
      mp_nums[5][1] = '\x03';
      mp_nums[5][2] = 'a';
      mp_nums[5][3] = 'b';
      mp_nums[5][4] = 'c';
      mp_nums[6][0] = -0x40;
      uVar13 = extraout_RDX_03;
      for (lVar14 = 0; lVar14 != 0x70; lVar14 = lVar14 + 0x10) {
        pcVar17 = mp_nums[0] + lVar14;
        cVar2 = *pcVar17;
        pcStack_270 = (char *)0x1225f5;
        mp_num_pos1 = pcVar17;
        iVar6 = mp_read_int32(&mp_num_pos1,(int32_t *)&mp_num_pos2);
        pcStack_270 = (char *)0x12261e;
        _ok((uint)(iVar6 == -1),"rc == -1",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
            0x76d,"check fail for code 0x%02X",(ulong)(uint)(int)cVar2);
        pcVar10 = "pos == bad_types[i]";
        pcStack_270 = (char *)0x122641;
        _ok((uint)(pcVar17 == mp_num_pos1),"pos == bad_types[i]",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
            0x76e,"check position for code 0x%02X",(ulong)(uint)(int)cVar2);
        uVar13 = extraout_RDX_04;
      }
      pcStack_270 = (char *)0x122659;
      test_read_num<long,int,int(*)(char_const**,long*)>
                (0x7b,(_func_int_char_ptr_ptr_long_ptr *)pcVar10,SUB81(uVar13,0));
      pcStack_270 = (char *)0x122663;
      test_read_num<long,int,int(*)(char_const**,long*)>
                (0x3039,(_func_int_char_ptr_ptr_long_ptr *)pcVar10,is_ok_16);
      pcStack_270 = (char *)0x12266d;
      test_read_num<long,int,int(*)(char_const**,long*)>
                (0x75bcd15,(_func_int_char_ptr_ptr_long_ptr *)pcVar10,is_ok_17);
      pcStack_270 = (char *)0x12267a;
      test_read_num<long,unsigned_long_long,int(*)(char_const**,long*)>
                (0x7fffffffffffffff,(_func_int_char_ptr_ptr_long_ptr *)0x1,is_ok_18);
      read_f_00 = (_func_int_char_ptr_ptr_long_ptr *)0x0;
      pcStack_270 = (char *)0x122689;
      test_read_num<long,unsigned_long_long,int(*)(char_const**,long*)>
                (0x8000000000000000,(_func_int_char_ptr_ptr_long_ptr *)0x0,is_ok_19);
      pcStack_270 = (char *)0x122691;
      test_read_num<long,int,int(*)(char_const**,long*)>(-0x7b,read_f_00,is_ok_20);
      pcStack_270 = (char *)0x12269b;
      test_read_num<long,int,int(*)(char_const**,long*)>(-0x3039,read_f_00,is_ok_21);
      pcStack_270 = (char *)0x1226a5;
      test_read_num<long,int,int(*)(char_const**,long*)>(-0x75bcd15,read_f_00,is_ok_22);
      uVar5 = str._12_4_;
      builtin_strncpy(str,"typed read of ",0xf);
      str[0xf] = SUB41(uVar5,3);
      pcStack_270 = (char *)0x1226df;
      iVar6 = snprintf(str + 0xe,0xf2,"%lld",0x8000000000000001);
      pcVar10 = str + (long)iVar6 + 0xe;
      pcStack_270 = (char *)0x12270b;
      iVar6 = snprintf(pcVar10,(size_t)(local_38 + -(long)pcVar10)," into ");
      pcStack_270 = (char *)0x122728;
      snprintf(pcVar10 + iVar6,(size_t)(local_38 + -(long)(pcVar10 + iVar6)),"int%zu_t",0x40);
      pcStack_270 = (char *)0x122737;
      _space((FILE *)_stdout);
      pcStack_270 = (char *)0x12274c;
      fwrite("# ",2,1,_stdout);
      pcStack_270 = (char *)0x12275c;
      fputs(str,_stdout);
      pcStack_270 = (char *)0x122767;
      fputc(10,_stdout);
      pcVar11 = (char *)0x8000000000000001;
      pcStack_270 = (char *)0x122777;
      uVar7 = test_encode_int_all_sizes(mp_nums,-0x7fffffffffffffff);
      uVar16 = (ulong)uVar7;
      if ((int)uVar7 < 1) {
        uVar16 = 0;
      }
      for (uVar18 = 0; uVar5 = str._12_4_, uVar16 * 0x10 != uVar18; uVar18 = uVar18 + 0x10) {
        pcVar10 = mp_nums[0] + uVar18;
        bVar1 = *pcVar10;
        mVar3 = mp_type_hint[bVar1];
        mp_num_pos1 = pcVar10;
        if (mVar3 == MP_UINT) {
          pcStack_270 = (char *)0x1227f4;
          uVar9 = mp_decode_uint(&mp_num_pos1);
          if (uVar9 != 0x8000000000000001) goto LAB_0012240b;
        }
        else if (mVar3 == MP_FLOAT) {
          pcStack_270 = (char *)0x1227db;
          fVar19 = mp_decode_float(&mp_num_pos1);
          if ((fVar19 != -9.223372e+18) || (NAN(fVar19))) goto LAB_00122bd1;
        }
        else if (mVar3 == MP_INT) {
          pcStack_270 = (char *)0x1227cc;
          iVar8 = mp_decode_int(&mp_num_pos1);
          if (iVar8 != -0x7fffffffffffffff) goto LAB_00122c1d;
        }
        else {
          pcStack_270 = (char *)0x122803;
          dVar4 = mp_decode_double(&mp_num_pos1);
          if ((dVar4 != -9.223372036854776e+18) || (NAN(dVar4))) goto LAB_0012300a;
        }
        local_248 = 0;
        pcStack_270 = (char *)0x122835;
        mp_num_pos2 = pcVar10;
        iVar6 = mp_read_int64(&mp_num_pos2,(int64_t *)&local_248);
        pcStack_270 = (char *)0x12285d;
        _ok((uint)(iVar6 == 0),"rc == 0",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
            0x73b,"check success for code 0x%02X",(ulong)(uint)(int)(char)bVar1);
        pcStack_270 = (char *)0x12288a;
        _ok((uint)(mp_num_pos1 == mp_num_pos2),"mp_num_pos1 == mp_num_pos2",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
            0x73c,"check position");
        if (-1 < (long)local_248) {
          pcVar10 = "num2 < 0";
          uVar13 = 0x745;
          goto LAB_0012307a;
        }
        pcStack_270 = (char *)0x1228be;
        _ok((uint)(local_248 == 0x8000000000000001),"(int64_t)num1 == (int64_t)num2",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
            0x746,"check int number");
      }
      builtin_strncpy(str,"typed read of ",0xf);
      str[0xf] = SUB41(uVar5,3);
      pcStack_270 = (char *)0x122906;
      iVar6 = snprintf(str + 0xe,0xf2,"%f",0);
      pcVar10 = str + (long)iVar6 + 0xe;
      pcStack_270 = (char *)0x122932;
      iVar6 = snprintf(pcVar10,(size_t)(local_38 + -(long)pcVar10)," into ");
      pcStack_270 = (char *)0x12294f;
      snprintf(pcVar10 + iVar6,(size_t)(local_38 + -(long)(pcVar10 + iVar6)),"int%zu_t",0x40);
      pcStack_270 = (char *)0x12295e;
      _space((FILE *)_stdout);
      pcStack_270 = (char *)0x122973;
      fwrite("# ",2,1,_stdout);
      pcStack_270 = (char *)0x122983;
      fputs(str,_stdout);
      pcStack_270 = (char *)0x12298e;
      fputc(10,_stdout);
      mp_nums[0][0] = -0x36;
      mp_nums[0][1] = 'B';
      mp_nums[0][2] = -0x38;
      mp_nums[0][3] = '\0';
      mp_nums[0][4] = '\0';
      mp_nums[1][0] = -0x35;
      mp_nums[1][1] = '@';
      mp_nums[1][2] = 'Y';
      mp_nums[1][3] = '\0';
      mp_nums[1][4] = '\0';
      mp_nums[1][5] = '\0';
      mp_nums[1][6] = '\0';
      mp_nums[1][7] = '\0';
      mp_nums[1][8] = '\0';
      for (lVar14 = 0; uVar5 = str._12_4_, lVar14 != 0x20; lVar14 = lVar14 + 0x10) {
        pcVar11 = mp_nums[0] + lVar14;
        bVar1 = *pcVar11;
        mVar3 = mp_type_hint[bVar1];
        mp_num_pos1 = pcVar11;
        if (mVar3 == MP_UINT) {
          pcStack_270 = (char *)0x122a2a;
          uVar9 = mp_decode_uint(&mp_num_pos1);
          if (uVar9 != 100) goto LAB_0012240b;
        }
        else if (mVar3 == MP_FLOAT) {
          pcStack_270 = (char *)0x122a11;
          fVar19 = mp_decode_float(&mp_num_pos1);
          if ((fVar19 != 100.0) || (NAN(fVar19))) goto LAB_00122bd1;
        }
        else if (mVar3 == MP_INT) {
          pcStack_270 = (char *)0x122a01;
          iVar8 = mp_decode_int(&mp_num_pos1);
          if (iVar8 != 100) goto LAB_00122c1d;
        }
        else {
          pcStack_270 = (char *)0x122a3a;
          dVar4 = mp_decode_double(&mp_num_pos1);
          if ((dVar4 != 100.0) || (NAN(dVar4))) goto LAB_0012300a;
        }
        uVar18 = (ulong)(uint)(int)(char)bVar1;
        local_248 = 0;
        pcStack_270 = (char *)0x122a6c;
        mp_num_pos2 = pcVar11;
        iVar6 = mp_read_int64(&mp_num_pos2,(int64_t *)&local_248);
        pcStack_270 = (char *)0x122a95;
        _ok((uint)(iVar6 == -1),"rc == -1",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
            0x737,"check failure for code 0x%02X",uVar18);
        pcStack_270 = (char *)0x122ab5;
        _ok((uint)(pcVar11 == mp_num_pos2),"mp_num_pos2 == mp_nums[i]",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
            0x738,"check position");
      }
      builtin_strncpy(str,"typed read of ",0xf);
      str[0xf] = SUB41(uVar5,3);
      pcStack_270 = (char *)0x122afd;
      iVar6 = snprintf(str + 0xe,0xf2,"%lf",0x6c22680a);
      pcVar10 = str + (long)iVar6 + 0xe;
      pcStack_270 = (char *)0x122b29;
      iVar6 = snprintf(pcVar10,(size_t)(local_38 + -(long)pcVar10)," into ");
      pcStack_270 = (char *)0x122b46;
      snprintf(pcVar10 + iVar6,(size_t)(local_38 + -(long)(pcVar10 + iVar6)),"int%zu_t",0x40);
      pcVar17 = &stdout;
      pcStack_270 = (char *)0x122b55;
      _space((FILE *)_stdout);
      pcVar10 = (char *)0x1;
      pcStack_270 = (char *)0x122b6d;
      fwrite("# ",2,1,_stdout);
      pcStack_270 = (char *)0x122b7d;
      fputs(str,_stdout);
      pcStack_270 = (char *)0x122b88;
      fputc(10,_stdout);
      mp_nums[0][0] = -0x35;
      mp_nums[0][1] = -0x40;
      mp_nums[0][2] = '\x15';
      mp_nums[0][3] = -0x46;
      mp_nums[0][4] = 'x';
      mp_nums[0][5] = 'l';
      mp_nums[0][6] = '\"';
      mp_nums[0][7] = 'h';
      mp_nums[0][8] = '\n';
      pacVar15 = mp_nums;
      mp_num_pos1 = *pacVar15;
      if (local_23c != MP_INT) {
        if (local_23c != MP_FLOAT) {
          if (local_23c == MP_UINT) {
LAB_00123089:
            data = &mp_num_pos1;
            pcStack_270 = (char *)test_next_on_array;
            mp_decode_uint(data);
            pcStack_288 = 
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc";
            pcStack_298 = pcVar10;
            pacStack_290 = pacVar15;
            pcStack_280 = pcVar17;
            uStack_278 = uVar18;
            pcStack_270 = pcVar11;
            _space((FILE *)_stdout);
            fwrite("# ",2,1,_stdout);
            uVar16 = 0;
            size = (uint32_t)data;
            fprintf(_stdout,"next/check on array(%u)",(ulong)data & 0xffffffff);
            fputc(10,_stdout);
            pcVar10 = mp_encode_array(buf + 1,size);
            uVar18 = (ulong)data & 0xffffffff;
            while( true ) {
              iVar6 = (int)uVar18;
              uVar18 = (ulong)(iVar6 - 1);
              if (iVar6 == 0) break;
              pcVar10 = mp_encode_uint(pcVar10,uVar16 % 0x7f);
              uVar16 = uVar16 + 1;
            }
            iVar6 = 1;
            if (0xf < size) {
              iVar6 = (0xffff < size) + 3 + (uint)(0xffff < size);
            }
            uVar7 = iVar6 + size;
            pcVar17 = (char *)(ulong)uVar7;
            pcStack_2a0 = buf + 1;
            pcStack_2a8 = buf + 1;
            iVar6 = mp_check(&pcStack_2a0,::str);
            _ok((uint)(iVar6 == 0),"!mp_check(&d2, data + BUF_MAXLEN)",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                ,0x2a9,"mp_check(array %u))",(ulong)data & 0xffffffff);
            _ok((uint)(pcVar10 + -0x148121 == pcVar17),"(d1 - data) == (ptrdiff_t)len",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                ,0x2aa,"len(array %u) == %u",(ulong)data & 0xffffffff,uVar7);
            _ok((uint)(pcStack_2a0 + -0x148121 == pcVar17),"(d2 - data) == (ptrdiff_t)len",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                ,0x2ab,"len(mp_check(array %u)) == %u",(ulong)data & 0xffffffff,uVar7);
            mp_next(&pcStack_2a8);
            _ok((uint)(pcStack_2a8 + -0x148121 == pcVar17),"(d3 - data) == (ptrdiff_t)len",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                ,0x2ad,"len(mp_next(array %u)) == %u",(ulong)data & 0xffffffff,uVar7);
            return extraout_EAX;
          }
          pcStack_270 = (char *)0x122c6c;
          dVar4 = mp_decode_double(&mp_num_pos1);
          if ((dVar4 == -5.4321) && (!NAN(dVar4))) goto LAB_00122c80;
          goto LAB_0012300a;
        }
        pcStack_270 = (char *)0x122bc2;
        fVar19 = mp_decode_float(&mp_num_pos1);
        if ((fVar19 == -5.4321) && (!NAN(fVar19))) {
LAB_00122c80:
          local_248 = 0;
          pcStack_270 = (char *)0x122c99;
          mp_num_pos2 = *pacVar15;
          iVar6 = mp_read_int64(&mp_num_pos2,(int64_t *)&local_248);
          pcStack_270 = (char *)0x122cca;
          _ok((uint)(iVar6 == -1),"rc == -1",
              "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
              ,0x737,"check failure for code 0x%02X",0xffffffffffffffcb);
          pcStack_270 = (char *)0x122cf0;
          _ok((uint)((char (*) [16])mp_num_pos2 == pacVar15),"mp_num_pos2 == mp_nums[i]",
              "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
              ,0x738,"check position");
          builtin_strncpy(str + 0x10,"f reading ",0xb);
          builtin_strncpy(str,"ensure failure o",0x10);
          pcStack_270 = (char *)0x122d24;
          snprintf(str + 0x1a,0xe6,"int%zu_t",0x40);
          pcStack_270 = (char *)0x122d33;
          _space((FILE *)_stdout);
          pcStack_270 = (char *)0x122d4c;
          fwrite("# ",2,1,_stdout);
          pcStack_270 = (char *)0x122d5c;
          fputs(str,_stdout);
          pcStack_270 = (char *)0x122d67;
          fputc(10,_stdout);
          mp_nums[0][0] = -0x6f;
          mp_nums[1][0] = -0x7f;
          pcStack_270 = (char *)0x122d85;
          mp_encode_str0(mp_nums[2],"abc");
          mp_nums[3][0] = -0x3d;
          mp_nums[4][0] = local_251;
          if (local_251 == '\0') {
            mp_nums[4][1] = '\x03';
            mp_nums[4][0] = 199;
            pcVar10 = (char *)0x2;
          }
          (pcVar10 + 0x40)[(long)mp_nums[0]] = '\x01';
          (pcVar10 + 0x43)[(long)mp_nums[0]] = 'c';
          (pcVar10 + 0x41 + (long)mp_nums[0])[0] = 'a';
          (pcVar10 + 0x41 + (long)mp_nums[0])[1] = 'b';
          mp_nums[5][0] = -0x3c;
          mp_nums[5][1] = '\x03';
          mp_nums[5][2] = 'a';
          mp_nums[5][3] = 'b';
          mp_nums[5][4] = 'c';
          mp_nums[6][0] = -0x40;
          uVar13 = extraout_RDX_05;
          for (lVar14 = 0; lVar14 != 0x70; lVar14 = lVar14 + 0x10) {
            pcVar10 = mp_nums[0] + lVar14;
            cVar2 = *pcVar10;
            pcStack_270 = (char *)0x122e10;
            mp_num_pos2 = pcVar10;
            iVar6 = mp_read_int64(&mp_num_pos2,(int64_t *)&mp_num_pos1);
            pcStack_270 = (char *)0x122e39;
            _ok((uint)(iVar6 == -1),"rc == -1",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                ,0x76d,"check fail for code 0x%02X",(ulong)(uint)(int)cVar2);
            pcStack_270 = (char *)0x122e5c;
            _ok((uint)(pcVar10 == mp_num_pos2),"pos == bad_types[i]",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                ,0x76e,"check position for code 0x%02X",(ulong)(uint)(int)cVar2);
            uVar13 = extraout_RDX_06;
          }
          pcStack_270 = (char *)0x122e74;
          test_read_num<double,int,int(*)(char_const**,double*)>
                    (0x7b,mp_read_double,SUB81(uVar13,0));
          pcStack_270 = (char *)0x122e81;
          test_read_num<double,int,int(*)(char_const**,double*)>(0x3039,mp_read_double,is_ok_23);
          pcStack_270 = (char *)0x122e8e;
          test_read_num<double,int,int(*)(char_const**,double*)>(0x75bcd15,mp_read_double,is_ok_24);
          pcStack_270 = (char *)0x122ea5;
          test_read_num<double,unsigned_long_long,int(*)(char_const**,double*)>
                    (0x11f71fb0450,mp_read_double,true);
          pcStack_270 = (char *)0x122ebc;
          test_read_num<double,unsigned_long_long,int(*)(char_const**,double*)>
                    (0x1b69b4bacd05f15,mp_read_double,false);
          pcStack_270 = (char *)0x122ecb;
          test_read_num<double,int,int(*)(char_const**,double*)>(-0x7b,mp_read_double,is_ok_25);
          pcStack_270 = (char *)0x122ed8;
          test_read_num<double,int,int(*)(char_const**,double*)>(-0x3039,mp_read_double,is_ok_26);
          pcStack_270 = (char *)0x122ee5;
          test_read_num<double,int,int(*)(char_const**,double*)>(-0x75bcd15,mp_read_double,is_ok_27)
          ;
          pcStack_270 = (char *)0x122efc;
          test_read_num<double,long_long,int(*)(char_const**,double*)>
                    (-0x11f71fb0450,mp_read_double,true);
          uVar12 = 0x39;
          pcStack_270 = (char *)0x122f13;
          test_read_num<double,long_long,int(*)(char_const**,double*)>
                    (-0x1b69b4bacd05f15,mp_read_double,false);
          pcStack_270 = (char *)0x122f1b;
          test_read_num<double,float,int(*)(char_const**,double*)>(num1,mp_read_double,(bool)uVar12)
          ;
          pcStack_270 = (char *)0x122f23;
          test_read_num<double,double,int(*)(char_const**,double*)>
                    ((double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da),mp_read_double,(bool)uVar12
                    );
          pcStack_270 = (char *)0x122f2b;
          test_read_num_from_non_numeric_mp<double,int(*)(char_const**,double*)>(mp_read_double);
          pcStack_270 = (char *)0x122f3d;
          test_read_num<double,int,int(*)(char_const**,double*)>(0x7b,mp_read_double_lossy,is_ok_28)
          ;
          pcStack_270 = (char *)0x122f4a;
          test_read_num<double,int,int(*)(char_const**,double*)>
                    (0x3039,mp_read_double_lossy,is_ok_29);
          pcStack_270 = (char *)0x122f57;
          test_read_num<double,int,int(*)(char_const**,double*)>
                    (0x75bcd15,mp_read_double_lossy,is_ok_30);
          pcStack_270 = (char *)0x122f6b;
          test_read_num<double,unsigned_long_long,int(*)(char_const**,double*)>
                    (0x11f71fb0450,mp_read_double_lossy,true);
          pcStack_270 = (char *)0x122f78;
          test_read_num<double,unsigned_long_long,int(*)(char_const**,double*)>
                    (0x1b69b4bacd05f15,mp_read_double_lossy,true);
          pcStack_270 = (char *)0x122f83;
          test_read_num<double,int,int(*)(char_const**,double*)>
                    (-0x7b,mp_read_double_lossy,is_ok_31);
          pcStack_270 = (char *)0x122f90;
          test_read_num<double,int,int(*)(char_const**,double*)>
                    (-0x3039,mp_read_double_lossy,is_ok_32);
          pcStack_270 = (char *)0x122f9d;
          test_read_num<double,int,int(*)(char_const**,double*)>
                    (-0x75bcd15,mp_read_double_lossy,is_ok_33);
          pcStack_270 = (char *)0x122faa;
          test_read_num<double,long_long,int(*)(char_const**,double*)>
                    (-0x11f71fb0450,mp_read_double_lossy,true);
          uVar12 = 0x40;
          pcStack_270 = (char *)0x122fb7;
          test_read_num<double,long_long,int(*)(char_const**,double*)>
                    (-0x1b69b4bacd05f15,mp_read_double_lossy,true);
          pcStack_270 = (char *)0x122fbf;
          test_read_num<double,float,int(*)(char_const**,double*)>
                    (num1_00,mp_read_double_lossy,(bool)uVar12);
          pcStack_270 = (char *)0x122fc7;
          test_read_num<double,double,int(*)(char_const**,double*)>
                    ((double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00),mp_read_double_lossy,
                     (bool)uVar12);
          pcStack_270 = (char *)0x122fcf;
          test_read_num_from_non_numeric_mp<double,int(*)(char_const**,double*)>
                    (mp_read_double_lossy);
          pcStack_270 = (char *)0x122fde;
          _space((FILE *)_stdout);
          pcStack_270 = (char *)0x122ff3;
          printf("# *** %s: done ***\n","test_mp_read_typed");
          pcStack_270 = (char *)0x122ff8;
          iVar6 = check_plan();
          return iVar6;
        }
        goto LAB_00122bd1;
      }
      pcStack_270 = (char *)0x122c17;
      iVar8 = mp_decode_int(&mp_num_pos1);
      if (iVar8 == -5) goto LAB_00122c80;
    }
LAB_00122c1d:
    pcVar10 = "mp_decode_int(&mp_num_pos1) == (int64_t)num1";
    uVar13 = 0x727;
  }
LAB_0012307a:
  local_268 = "test_read_num";
  pcStack_270 = (char *)0x123081;
  fprintf(_stderr,"Test failed: %s is %s at %s:%d, in function \'%s\'\n",pcVar10,"false",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          uVar13);
  pcStack_270 = (char *)0x123089;
  exit(-1);
}

Assistant:

static int
test_mp_read_typed()
{
	plan(716);
	header();

	test_read_int8(12, true);
	test_read_int8(127, true);
	test_read_int8(128, false);
	test_read_int8(-12, true);
	test_read_int8(-128, true);
	test_read_int8(-129, false);
	test_read_int8(-3e-4f, false);
	test_read_int8(123.45, false);
	test_read_num_from_non_numeric_mp<int8_t>(mp_read_int8);

	test_read_int16(123, true);
	test_read_int16(32767, true);
	test_read_int16(32768, false);
	test_read_int16(-123, true);
	test_read_int16(-32768, true);
	test_read_int16(-32769, false);
	test_read_int16(-2e-3f, false);
	test_read_int16(12.345, false);
	test_read_num_from_non_numeric_mp<int16_t>(mp_read_int16);

	test_read_int32(123, true);
	test_read_int32(12345, true);
	test_read_int32(2147483647, true);
	test_read_int32(2147483648, false);
	test_read_int32(-123, true);
	test_read_int32(-12345, true);
	test_read_int32(-2147483648, true);
	test_read_int32(-2147483649LL, false);
	test_read_int32(-1e2f, false);
	test_read_int32(1.2345, false);
	test_read_num_from_non_numeric_mp<int32_t>(mp_read_int32);

	test_read_int64(123, true);
	test_read_int64(12345, true);
	test_read_int64(123456789, true);
	test_read_int64(9223372036854775807ULL, true);
	test_read_int64(9223372036854775808ULL, false);
	test_read_int64(-123, true);
	test_read_int64(-12345, true);
	test_read_int64(-123456789, true);
	test_read_int64(-9223372036854775807LL, true);
	test_read_int64(100.0f, false);
	test_read_int64(-5.4321, false);
	test_read_num_from_non_numeric_mp<int64_t>(mp_read_int64);

	test_read_double(123, true);
	test_read_double(12345, true);
	test_read_double(123456789, true);
	test_read_double(1234567890000ULL, true);
	test_read_double(123456789123456789ULL, false);
	test_read_double(-123, true);
	test_read_double(-12345, true);
	test_read_double(-123456789, true);
	test_read_double(-1234567890000LL, true);
	test_read_double(-123456789123456789LL, false);
	test_read_double(6.565e6f, true);
	test_read_double(-5.555, true);
	test_read_num_from_non_numeric_mp<double>(mp_read_double);

	test_read_double_lossy(123, true);
	test_read_double_lossy(12345, true);
	test_read_double_lossy(123456789, true);
	test_read_double_lossy(1234567890000ULL, true);
	test_read_double_lossy(123456789123456789ULL, true);
	test_read_double_lossy(-123, true);
	test_read_double_lossy(-12345, true);
	test_read_double_lossy(-123456789, true);
	test_read_double_lossy(-1234567890000LL, true);
	test_read_double_lossy(-123456789123456789LL, true);
	test_read_double_lossy(6.565e6f, true);
	test_read_double_lossy(-5.555, true);
	test_read_num_from_non_numeric_mp<double>(mp_read_double_lossy);

	footer();
	return check_plan();
}